

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatBuffer.h
# Opt level: O0

void __thiscall
slang::FormatBuffer::format<int&,int&>
          (FormatBuffer *this,format_string<int_&,_int_&> fmt,int *args,int *args_1)

{
  undefined4 *in_RCX;
  undefined4 *in_R8;
  buffer<char> *in_stack_00000028;
  locale_ref in_stack_00000030;
  undefined1 in_stack_00000038 [16];
  string_view in_stack_00000048;
  locale_ref local_c0;
  undefined4 local_b8 [4];
  undefined4 local_a8 [6];
  undefined8 local_90;
  undefined4 *local_88;
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined4 local_2c;
  undefined4 *local_28;
  undefined4 local_1c;
  undefined4 *local_18;
  undefined4 *local_10;
  undefined8 *local_8;
  
  local_48 = local_58;
  local_2c = *in_RCX;
  local_28 = local_b8;
  local_18 = local_a8;
  local_1c = *in_R8;
  local_8 = &local_90;
  local_10 = local_b8;
  local_90 = 0x11;
  local_b8[0] = local_2c;
  local_a8[0] = local_1c;
  local_88 = local_10;
  ::fmt::v11::detail::locale_ref::locale_ref(&local_c0);
  ::fmt::v11::detail::vformat_to
            (in_stack_00000028,in_stack_00000048,(format_args)in_stack_00000038,in_stack_00000030);
  return;
}

Assistant:

void format(fmt::format_string<Args...> fmt, Args&&... args) {
        fmt::detail::vformat_to(buf, fmt::string_view(fmt), fmt::make_format_args(args...));
    }